

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.cpp
# Opt level: O2

ostream * Inferences::operator<<(ostream *o,OverlayBinder *binder)

{
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  BindingsMap *__range1;
  value_type binding;
  TermList local_90;
  _Hash_node_base *local_88;
  TermList aTStack_80 [2];
  string local_70;
  string local_50;
  
  std::operator<<(o,"OverlayBinder { ");
  p_Var3 = &(binder->m_base)._M_h._M_before_begin;
  bVar1 = true;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    local_88 = p_Var3[1]._M_nxt;
    aTStack_80[0]._content =
         *(uint64_t *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    if (!bVar1) {
      std::operator<<(o,", ");
    }
    local_90._content = (uint64_t)((int)local_88 * 4 + 1);
    Kernel::TermList::toString_abi_cxx11_(&local_50,&local_90,false);
    poVar2 = std::operator<<(o,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    Kernel::TermList::toString_abi_cxx11_(&local_70,aTStack_80,false);
    std::operator<<(poVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = false;
  }
  std::operator<<(o," / ");
  p_Var3 = &(binder->m_overlay)._M_h._M_before_begin;
  bVar1 = true;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    local_88 = p_Var3[1]._M_nxt;
    aTStack_80[0]._content =
         *(uint64_t *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    if (!bVar1) {
      std::operator<<(o,", ");
    }
    local_90._content = (uint64_t)((int)local_88 * 4 + 1);
    Kernel::TermList::toString_abi_cxx11_(&local_50,&local_90,false);
    poVar2 = std::operator<<(o,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    Kernel::TermList::toString_abi_cxx11_(&local_70,aTStack_80,false);
    std::operator<<(poVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = false;
  }
  std::operator<<(o," }");
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, OverlayBinder const& binder)
{
  o << "OverlayBinder { ";
  bool first = true;
  for (auto binding : binder.m_base) {
    if (!first) {
      o << ", ";
    } else {
      first = false;
    }
    o << TermList(binding.first, false).toString() << " -> " << binding.second.toString();
  }
  o << " / ";
  first = true;
  for (auto binding : binder.m_overlay) {
    if (!first) {
      o << ", ";
    } else {
      first = false;
    }
    o << TermList(binding.first, false).toString() << " -> " << binding.second.toString();
  }
  o << " }";
  return o;
}